

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int upb_JsonDecodeDetectingNonconformance
              (char *buf,size_t size,upb_Message *msg,upb_MessageDef *m,upb_DefPool *symtab,
              int options,upb_Arena *arena,upb_Status *status)

{
  int iVar1;
  jsondec local_118;
  
  if (((ulong)msg->field_0 & 1) == 0) {
    if (size == 0) {
      iVar1 = 1;
    }
    else {
      local_118.end = buf + size;
      local_118.arena = arena;
      local_118.status = status;
      local_118.depth = 0x40;
      local_118.result = 0;
      local_118.line = 1;
      local_118.debug_field = (upb_FieldDef *)0x0;
      local_118.is_first = false;
      local_118.ptr = buf;
      local_118.symtab = symtab;
      local_118.line_begin = buf;
      local_118.options = options;
      iVar1 = upb_JsonDecoder_Decode(&local_118,msg,m);
    }
    return iVar1;
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                ,0x616,
                "int upb_JsonDecodeDetectingNonconformance(const char *, size_t, upb_Message *, const upb_MessageDef *, const upb_DefPool *, int, upb_Arena *, upb_Status *)"
               );
}

Assistant:

int upb_JsonDecodeDetectingNonconformance(const char* buf, size_t size,
                                          upb_Message* msg,
                                          const upb_MessageDef* m,
                                          const upb_DefPool* symtab,
                                          int options, upb_Arena* arena,
                                          upb_Status* status) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  jsondec d;

  if (size == 0) return true;

  d.ptr = buf;
  d.end = buf + size;
  d.arena = arena;
  d.symtab = symtab;
  d.status = status;
  d.options = options;
  d.depth = 64;
  d.result = kUpb_JsonDecodeResult_Ok;
  d.line = 1;
  d.line_begin = d.ptr;
  d.debug_field = NULL;
  d.is_first = false;

  return upb_JsonDecoder_Decode(&d, msg, m);
}